

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSTree.hpp
# Opt level: O0

void __thiscall BSTree<int>::print(BSTree<int> *this,BSTNode<int> *tree,int key,int direction)

{
  _Setw _Var1;
  ostream *poVar2;
  char *pcVar3;
  int direction_local;
  int key_local;
  BSTNode<int> *tree_local;
  BSTree<int> *this_local;
  
  if (tree != (BSTNode<int> *)0x0) {
    if (direction == 0) {
      _Var1 = std::setw(2);
      poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,tree->key);
      poVar2 = std::operator<<(poVar2," is root");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      _Var1 = std::setw(2);
      poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,tree->key);
      poVar2 = std::operator<<(poVar2," is ");
      _Var1 = std::setw(2);
      poVar2 = std::operator<<(poVar2,_Var1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,key);
      poVar2 = std::operator<<(poVar2,"\'s ");
      _Var1 = std::setw(0xc);
      poVar2 = std::operator<<(poVar2,_Var1);
      pcVar3 = "left child";
      if (direction == 1) {
        pcVar3 = "right child";
      }
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    print(this,tree->left,tree->key,-1);
    print(this,tree->right,tree->key,1);
  }
  return;
}

Assistant:

void BSTree<T>::print(BSTNode<T>* tree, T key, int direction)
{
	if (tree != nullptr) {
		if (direction == 0) {
			std::cout << std::setw(2) << tree->key << " is root" << std::endl;

		} else {
			std::cout << std::setw(2) << tree->key << " is " << std::setw(2)
			<< key << "'s " << std::setw(12) << (direction == 1 ? "right child" : "left child") << std::endl;
		}

		print(tree->left, tree->key, -1);
		print(tree->right, tree->key, 1);
	}
}